

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O0

char * cmime_string_strip(char *s)

{
  size_t sVar1;
  ushort **ppuVar2;
  bool bVar3;
  char *local_18;
  char *e;
  char *s_local;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,0x46,"char *cmime_string_strip(char *)");
  }
  sVar1 = strlen(s);
  local_18 = s + sVar1;
  e = s;
  while( true ) {
    bVar3 = false;
    if (*e != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)*e] & 0x2000) != 0;
    }
    if (!bVar3) break;
    e = e + 1;
  }
  while( true ) {
    local_18 = local_18 + -1;
    bVar3 = false;
    if (e < local_18) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)*local_18] & 0x2000) != 0;
    }
    if (!bVar3) break;
    *local_18 = '\0';
  }
  return e;
}

Assistant:

char *cmime_string_strip(char *s) {
    assert(s);

    char * e = s + strlen(s) - 1;
    while(*s && isspace(*s)) s++;
    while(e > s && isspace(*e)) *e-- = '\0';

    return(s);
}